

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Geometry::buildMeshes(Geometry *this)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Triangle *pTVar4;
  MeshHeader *this_00;
  Material **ppMVar5;
  void *__s;
  int iVar6;
  MeshHeader *pMVar7;
  long lVar8;
  long lVar9;
  
  if ((this->flags & 0x1000000) == 0) {
    (*DAT_00149de0)(this->meshHeader);
    this->meshHeader = (MeshHeader *)0x0;
    if ((this->flags & 1) != 0) {
      buildTristrips(this);
      return;
    }
    iVar2 = (this->matList).numMaterials;
    lVar9 = (long)iVar2;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 529"
    ;
    __s = (void *)(*DAT_00149de8)(lVar9 * 4);
    memset(__s,0,lVar9 * 4);
    iVar6 = this->numTriangles;
    if (0 < iVar6) {
      pTVar4 = this->triangles;
      lVar8 = 0;
      do {
        piVar1 = (int *)((long)__s + (ulong)pTVar4[lVar8].matId * 4);
        *piVar1 = *piVar1 + 3;
        iVar6 = this->numTriangles;
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 < iVar6);
    }
    allocateMeshes(this,iVar2,iVar6 * 3,0);
    this_00 = this->meshHeader;
    if (0 < iVar2) {
      ppMVar5 = (this->matList).materials;
      pMVar7 = this_00 + 2;
      lVar8 = 0;
      do {
        *(Material **)pMVar7 = ppMVar5[lVar8];
        pMVar7[-1].totalIndices = *(uint32 *)((long)__s + lVar8 * 4);
        lVar8 = lVar8 + 1;
        pMVar7 = (MeshHeader *)&pMVar7[1].totalIndices;
      } while (lVar9 != lVar8);
    }
    MeshHeader::setupIndices(this_00);
    (*DAT_00149de0)(__s);
    if (0 < iVar2) {
      lVar8 = 0;
      do {
        *(undefined4 *)((long)&this_00[1].totalIndices + lVar8) = 0;
        lVar8 = lVar8 + 0x18;
      } while (lVar9 * 0x18 != lVar8);
    }
    iVar2 = this->numTriangles;
    if (0 < iVar2) {
      pTVar4 = this->triangles;
      lVar9 = 0;
      do {
        uVar3 = *(uint *)((long)this_00 + (ulong)pTVar4[lVar9].matId * 0x18 + 0x18);
        *(uint16 *)
         (*(long *)((long)this_00 + (ulong)pTVar4[lVar9].matId * 0x18 + 0x10) + (ulong)uVar3 * 2) =
             pTVar4[lVar9].v[0];
        *(uint16 *)
         (*(long *)((long)this_00 + (ulong)pTVar4[lVar9].matId * 0x18 + 0x10) +
         (ulong)(uVar3 + 1) * 2) = pTVar4[lVar9].v[1];
        *(uint16 *)
         (*(long *)((long)this_00 + (ulong)pTVar4[lVar9].matId * 0x18 + 0x10) +
         (ulong)(uVar3 + 2) * 2) = pTVar4[lVar9].v[2];
        *(uint *)((long)this_00 + (ulong)pTVar4[lVar9].matId * 0x18 + 0x18) = uVar3 + 3;
        lVar9 = lVar9 + 1;
      } while (iVar2 != (int)lVar9);
    }
  }
  else {
    buildMeshes();
  }
  return;
}

Assistant:

void
Geometry::buildMeshes(void)
{
	Triangle *tri;
	Mesh *mesh;

	if(this->flags & Geometry::NATIVE){
		fprintf(stderr, "WARNING: trying Geometry::buildMeshes() on pre-instanced geometry\n");
		return;
	}

	rwFree(this->meshHeader);
	this->meshHeader = nil;
	int32 numMeshes = this->matList.numMaterials;
	if((this->flags & Geometry::TRISTRIP) == 0){
		int32 *numIndices = rwNewT(int32, numMeshes,
			MEMDUR_FUNCTION | ID_GEOMETRY);
		memset(numIndices, 0, numMeshes*sizeof(int32));

		// count indices per mesh
		tri = this->triangles;
		for(int32 i = 0; i < this->numTriangles; i++){
			assert(tri->matId < numMeshes);
			numIndices[tri->matId] += 3;
			tri++;
		}
		// setup meshes
		this->allocateMeshes(numMeshes, this->numTriangles*3, 0);
		mesh = this->meshHeader->getMeshes();
		for(int32 i = 0; i < numMeshes; i++){
			mesh[i].material = this->matList.materials[i];
			mesh[i].numIndices = numIndices[i];
		}
		this->meshHeader->setupIndices();
		rwFree(numIndices);

		// now fill in the indices
		for(int32 i = 0; i < numMeshes; i++)
			mesh[i].numIndices = 0;
		tri = this->triangles;
		for(int32 i = 0; i < this->numTriangles; i++){
			uint32 idx = mesh[tri->matId].numIndices;
			mesh[tri->matId].indices[idx++] = tri->v[0];
			mesh[tri->matId].indices[idx++] = tri->v[1];
			mesh[tri->matId].indices[idx++] = tri->v[2];
			mesh[tri->matId].numIndices = idx;
			tri++;
		}
	}else
		this->buildTristrips();
}